

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O1

QString * QMakeEvaluator::quoteValue(QString *__return_storage_ptr__,ProString *val)

{
  ArrayOptions *pAVar1;
  char16_t cVar2;
  int iVar3;
  Data *pDVar4;
  bool bVar5;
  char16_t *pcVar6;
  long lVar7;
  AllocationOption AVar8;
  char *pcVar9;
  QChar QVar10;
  long lVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QLatin1String QVar13;
  QByteArrayView QVar14;
  QLatin1String QVar15;
  QArrayData *local_68 [3];
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  AVar8 = Grow;
  if (0 < val->m_length) {
    AVar8 = val->m_length;
  }
  QString::reallocData((longlong)__return_storage_ptr__,AVar8);
  pDVar4 = (__return_storage_ptr__->d).d;
  if ((pDVar4 != (Data *)0x0) && ((pDVar4->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar4->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pcVar6 = (val->m_string).d.ptr;
  if (pcVar6 == (char16_t *)0x0) {
    pcVar6 = (char16_t *)&QString::_empty;
  }
  lVar7 = (long)val->m_length;
  bVar12 = lVar7 == 0;
  QVar10.ucs = (char16_t)__return_storage_ptr__;
  if (lVar7 < 1) {
    bVar5 = false;
  }
  else {
    iVar3 = val->m_offset;
    bVar12 = val->m_length == 0;
    lVar11 = 0;
    bVar5 = false;
    do {
      cVar2 = pcVar6[iVar3 + lVar11];
      if ((ushort)cVar2 < 0x20) {
        if (!bVar5) {
          QVar13.m_data = (char *)0x10;
          QVar13.m_size = (qsizetype)__return_storage_ptr__;
          QString::append(QVar13);
          bVar5 = true;
        }
        if (cVar2 == L'\t') {
          pcVar9 = (char *)0x3;
          goto LAB_00262747;
        }
        if (cVar2 == L'\n') {
          pcVar9 = (char *)0x3;
          goto LAB_00262747;
        }
        if (cVar2 == L'\r') {
          pcVar9 = (char *)0x3;
          goto LAB_00262747;
        }
        QVar14.m_data = (storage_type *)0x5;
        QVar14.m_size = (qsizetype)local_68;
        QString::fromLatin1(QVar14);
        QString::arg_impl((ulonglong)local_50,(int)local_68,(uint)(ushort)cVar2,(QChar)0x2);
        QString::append((QString *)__return_storage_ptr__);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (local_68[0] != (QArrayData *)0x0) {
          LOCK();
          (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_68[0],2,0x10);
          }
        }
        goto LAB_0026274c;
      }
      if (bVar5) {
        QString::append(QVar10);
        bVar5 = false;
      }
      switch(cVar2) {
      case L' ':
        bVar12 = true;
      case L'!':
      case L'%':
      case L'&':
        goto switchD_00262612_caseD_21;
      case L'\"':
        pcVar9 = (char *)0x2;
        break;
      case L'#':
        pcVar9 = (char *)0x10;
        break;
      case L'$':
        pcVar9 = (char *)0x2;
        break;
      case L'\'':
        pcVar9 = (char *)0x2;
        break;
      default:
        if (cVar2 == L'\\') {
          pcVar9 = (char *)0x2;
          break;
        }
        goto switchD_00262612_caseD_21;
      }
LAB_00262747:
      QVar15.m_data = pcVar9;
      QVar15.m_size = (qsizetype)__return_storage_ptr__;
      QString::append(QVar15);
LAB_0026274c:
      lVar11 = lVar11 + 1;
    } while (lVar7 != lVar11);
  }
  if (bVar5) {
    QString::append(QVar10);
  }
  if (bVar12) {
    QString::insert((longlong)__return_storage_ptr__,(QChar)0x0);
    QString::append(QVar10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
switchD_00262612_caseD_21:
  QString::append(QVar10);
  goto LAB_0026274c;
}

Assistant:

QString
QMakeEvaluator::quoteValue(const ProString &val)
{
    QString ret;
    ret.reserve(val.size());
    const QChar *chars = val.constData();
    bool quote = val.isEmpty();
    bool escaping = false;
    for (int i = 0, l = val.size(); i < l; i++) {
        QChar c = chars[i];
        ushort uc = c.unicode();
        if (uc < 32) {
            if (!escaping) {
                escaping = true;
                ret += QLatin1String("$$escape_expand(");
            }
            switch (uc) {
            case '\r':
                ret += QLatin1String("\\\\r");
                break;
            case '\n':
                ret += QLatin1String("\\\\n");
                break;
            case '\t':
                ret += QLatin1String("\\\\t");
                break;
            default:
                ret += QString::fromLatin1("\\\\x%1").arg(uc, 2, 16, QLatin1Char('0'));
                break;
            }
        } else {
            if (escaping) {
                escaping = false;
                ret += QLatin1Char(')');
            }
            switch (uc) {
            case '\\':
                ret += QLatin1String("\\\\");
                break;
            case '"':
                ret += QLatin1String("\\\"");
                break;
            case '\'':
                ret += QLatin1String("\\'");
                break;
            case '$':
                ret += QLatin1String("\\$");
                break;
            case '#':
                ret += QLatin1String("$${LITERAL_HASH}");
                break;
            case 32:
                quote = true;
                Q_FALLTHROUGH();
            default:
                ret += c;
                break;
            }
        }
    }
    if (escaping)
        ret += QLatin1Char(')');
    if (quote) {
        ret.prepend(QLatin1Char('"'));
        ret.append(QLatin1Char('"'));
    }
    return ret;
}